

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_550beb::ReferenceType::printRight(ReferenceType *this,OutputStream *s)

{
  int iVar1;
  undefined4 extraout_var;
  Node *pNVar2;
  char cVar3;
  
  if (this->Printing != false) {
    return;
  }
  this->Printing = true;
  pNVar2 = this->Pointee;
  while( true ) {
    iVar1 = (*pNVar2->_vptr_Node[3])(pNVar2,s);
    if (*(char *)(CONCAT44(extraout_var,iVar1) + 8) != '\f') break;
    pNVar2 = *(Node **)(CONCAT44(extraout_var,iVar1) + 0x10);
  }
  if (pNVar2->ArrayCache == Unknown) {
    iVar1 = (*pNVar2->_vptr_Node[1])(pNVar2,s);
    cVar3 = (char)iVar1;
  }
  else {
    cVar3 = pNVar2->ArrayCache == Yes;
  }
  if (cVar3 == '\0') {
    if (pNVar2->FunctionCache == Unknown) {
      iVar1 = (*pNVar2->_vptr_Node[2])(pNVar2,s);
      cVar3 = (char)iVar1;
    }
    else {
      cVar3 = pNVar2->FunctionCache == Yes;
    }
    if (cVar3 == '\0') goto LAB_001c17c9;
  }
  OutputStream::grow(s,1);
  s->Buffer[s->CurrentPosition] = ')';
  s->CurrentPosition = s->CurrentPosition + 1;
LAB_001c17c9:
  (*pNVar2->_vptr_Node[5])(pNVar2,s);
  this->Printing = false;
  return;
}

Assistant:

void printRight(OutputStream &s) const override {
    if (Printing)
      return;
    SwapAndRestore<bool> SavePrinting(Printing, true);
    std::pair<ReferenceKind, const Node *> Collapsed = collapse(s);
    if (Collapsed.second->hasArray(s) || Collapsed.second->hasFunction(s))
      s += ")";
    Collapsed.second->printRight(s);
  }